

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitem.cpp
# Opt level: O3

void depspawn::internal::Workitem::Clean_worklist(Workitem *worklist_wait_hint)

{
  Workitem *pWVar1;
  ulong uVar2;
  Workitem *pWVar3;
  Workitem *pWVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  Workitem *last_workitem;
  Workitem *local_40;
  Workitem *local_38;
  
  if (Clean_worklist(depspawn::internal::Workitem*)::Dones == '\0') {
    Clean_worklist();
  }
  if (Clean_worklist(depspawn::internal::Workitem*)::Deletable_Sublists == '\0') {
    Clean_worklist();
  }
  pWVar3 = (anonymous_namespace)::worklist;
  if ((anonymous_namespace)::worklist->next != (Workitem *)0x0) {
    uVar8 = 0;
    pWVar1 = (anonymous_namespace)::worklist->next;
    pWVar4 = (anonymous_namespace)::worklist;
    do {
      local_40 = pWVar1;
      if (local_40->status == Deallocatable) {
        uVar8 = uVar8 + 1;
      }
      else {
        if (local_40->status == Done) {
          if (Clean_worklist::Dones.
              super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              Clean_worklist::Dones.
              super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<depspawn::internal::Workitem*,std::allocator<depspawn::internal::Workitem*>>
            ::_M_realloc_insert<depspawn::internal::Workitem*const&>
                      ((vector<depspawn::internal::Workitem*,std::allocator<depspawn::internal::Workitem*>>
                        *)&Clean_worklist::Dones,
                       (iterator)
                       Clean_worklist::Dones.
                       super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_40);
          }
          else {
            *Clean_worklist::Dones.
             super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = local_40;
            Clean_worklist::Dones.
            super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 Clean_worklist::Dones.
                 super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        if (4 < uVar8) {
          std::
          vector<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>,std::allocator<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>>>
          ::emplace_back<depspawn::internal::Workitem*&,depspawn::internal::Workitem*&>
                    ((vector<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>,std::allocator<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>>>
                      *)&Clean_worklist::Deletable_Sublists,&pWVar4->next,&local_38);
          pWVar4->next = local_40;
        }
        uVar8 = 0;
        pWVar4 = local_40;
      }
      pWVar1 = local_40->next;
      local_38 = local_40;
    } while (pWVar1 != (Workitem *)0x0);
    pWVar3 = (anonymous_namespace)::worklist;
    if (pWVar4->next != (Workitem *)0x0) {
      local_40 = pWVar1;
      std::
      vector<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>,std::allocator<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>>>
      ::emplace_back<depspawn::internal::Workitem*&,depspawn::internal::Workitem*&>
                ((vector<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>,std::allocator<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>>>
                  *)&Clean_worklist::Deletable_Sublists,&pWVar4->next,&local_38);
      pWVar4->next = (Workitem *)0x0;
      pWVar3 = (anonymous_namespace)::worklist;
    }
  }
  for (; pWVar3 != worklist_wait_hint; pWVar3 = pWVar3->next) {
    do {
    } while (pWVar3->status == Filling);
    if ((pWVar3->optFlags_ & 3) == 0) break;
  }
  if ((long)Clean_worklist::Dones.
            super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)Clean_worklist::Dones.
            super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar5 = (long)Clean_worklist::Dones.
                  super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)Clean_worklist::Dones.
                  super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
    lVar6 = 0;
    do {
      do {
      } while (Clean_worklist::Dones.
               super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar6]->status == Done);
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5 + (ulong)(lVar5 == 0));
    if (Clean_worklist::Dones.
        super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        Clean_worklist::Dones.
        super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      Clean_worklist::Dones.
      super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           Clean_worklist::Dones.
           super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  if (Clean_worklist::Deletable_Sublists.
      super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      Clean_worklist::Deletable_Sublists.
      super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      pWVar3 = Clean_worklist::Deletable_Sublists.
               super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7].first;
      pWVar1 = Clean_worklist::Deletable_Sublists.
               super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7].second;
      pWVar4 = (Workitem *)Pool._32_8_;
      do {
        pWVar1->next = pWVar4;
        LOCK();
        bVar9 = pWVar4 != (Workitem *)Pool._32_8_;
        uVar2 = ((ulong)pWVar4 & 0xffff000000000000) + 0x1000000000000 | (ulong)pWVar3;
        if (bVar9) {
          pWVar4 = (Workitem *)Pool._32_8_;
          uVar2 = Pool._32_8_;
        }
        Pool._32_8_ = uVar2;
        UNLOCK();
      } while (bVar9);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)Clean_worklist::Deletable_Sublists.
                                   super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)Clean_worklist::Deletable_Sublists.
                                   super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (Clean_worklist::Deletable_Sublists.
      super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      Clean_worklist::Deletable_Sublists.
      super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    Clean_worklist::Deletable_Sublists.
    super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         Clean_worklist::Deletable_Sublists.
         super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  LOCK();
  (anonymous_namespace)::eraser_assigned = 0;
  UNLOCK();
  return;
}

Assistant:

void Workitem::Clean_worklist(Workitem *worklist_wait_hint)
    { static std::vector<Workitem *> Dones;
      static std::vector< std::pair<Workitem *, Workitem *> > Deletable_Sublists;

      DEPSPAWN_PROFILEDEFINITION(const auto t0 = std::chrono::high_resolution_clock::now());
      //DEPSPAWN_PROFILEDEFINITION(unsigned int profile_deleted_workitems = 0);
      DEPSPAWN_PROFILEACTION(profile_erases++);

      Workitem *lastkeep = worklist.load();
      Workitem *last_workitem, *p;
      
      unsigned int deletable_workitems = 0;

      for(p = lastkeep->next; p != nullptr; p = p->next) {
        
        if( p->status != Status_t::Deallocatable ) {
          
          if(p->status == Status_t::Done) {
            Dones.push_back(p);
          }
          
          if (deletable_workitems > 4) { //We ask for a minimum that justifies the cost
            Deletable_Sublists.emplace_back(lastkeep->next, last_workitem); // Deleted sublist
            lastkeep->next = p;
            //DEPSPAWN_PROFILEACTION(profile_deleted_workitems += deletable_workitems);
          }
          
          lastkeep = p;
          deletable_workitems = 0;
          
        } else {
          deletable_workitems++;
        }
        
        last_workitem = p;
      }

      if (lastkeep->next != nullptr) {
        Deletable_Sublists.emplace_back(lastkeep->next, last_workitem);
        lastkeep->next = nullptr;
        //DEPSPAWN_PROFILEACTION(profile_deleted_workitems += deletable_workitems);
      }

      std::atomic_thread_fence(std::memory_order_seq_cst);

      //DEPSPAWN_PROFILEACTION(printf("D %u (%u) (%u) %c\n", profile_deleted_workitems, (unsigned)Dones.size(), (unsigned)Deletable_Sublists.size(), ));

      p = worklist.load(std::memory_order_seq_cst);
#ifdef __arm64__
        // Make sure changes are seen in insert_in_worklist upon insertion in worklist
        // See semantics of std::atomic_thread_fence
        while(!worklist.compare_exchange_weak(p, p));
#endif

      for( ; p != worklist_wait_hint; p = p->next) {
        
        while(p->status == Status_t::Filling) { } // Waits until work p has its dependencies
        
        if(! (p->optFlags_ & (OptFlags::PendingFills|OptFlags::FatherScape)) ) {
          break;
        }
        
      }

      for (int i = 0; i < Dones.size(); i++) {
        while (Dones[i]->status == Status_t::Done) { }
      }
      Dones.clear(); //Needed because it is static!

      for (int i = 0; i < Deletable_Sublists.size(); i++) {
        Workitem * const begin = Deletable_Sublists[i].first;
        Workitem * const end = Deletable_Sublists[i].second;
        DEPSPAWN_DEBUGACTION(
                             for(Workitem *q = begin;  q != end->next; q = q->next) {
                               assert(q->args == nullptr);
                               assert(q->status == Status_t::Deallocatable);
                               if (q->deps) {
                                 printf("%p -> %p\n", q, q->deps);
                                 assert(q->deps == nullptr);
                               }
                             }
                             ); // END DEPSPAWN_DEBUGACTION
        
        Workitem::Pool.freeLinkedList(begin, end);
      }
      Deletable_Sublists.clear(); //Needed because it is static!
      
      DEPSPAWN_PROFILEACTION(profile_time_eraser_waiting += std::chrono::duration <double>(std::chrono::high_resolution_clock::now() - t0).count());
      
      /*
       for(p = next; p; p = p->next) {
         last_workitem = p;
         if( p->status != Status_t::Deallocatable )
         lastkeep = p;
       }
       
       Workitem *dp = lastkeep->next; // Everything from here will be deleted
       lastkeep->next = nullptr;
       
       if (dp != nullptr) {
       
         for(p = worklist; p != worklist_wait_hint; p = p->next) {
           while(p->status == Status_t::Filling) { } // Waits until work p has its dependencies
           if(! (p->optFlags_ & (OptFlags::PendingFills|OptFlags::FatherScape)) ) {
             break;
           }
         }
       
         DEPSPAWN_PROFILEACTION(profile_time_eraser_waiting += std::chrono::duration <double>(std::chrono::high_resolution_clock::now() - t0).count());
       
         DEPSPAWN_DEBUGACTION(
           for(p = dp; p; p = p->next) {
             assert(p-> args == nullptr);
             if (p->deps) {
               printf("%p -> %p\n", p, p->deps);
               assert(p->deps == nullptr);
             }
           }
         ); // END DEPSPAWN_DEBUGACTION
       
         Workitem::Pool.freeLinkedList(dp, last_workitem);
       }
       */
      
      eraser_assigned = false;
    }